

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O1

blip_time_t __thiscall Blip_Buffer::count_clocks(Blip_Buffer *this,long count)

{
  uint uVar1;
  
  uVar1 = this->factor_;
  if (uVar1 != 0) {
    if (this->buffer_size_ < count) {
      count = (long)this->buffer_size_;
    }
    return (~this->offset_ + uVar1 + (int)count * 0x10000) / uVar1;
  }
  return 0;
}

Assistant:

blip_time_t Blip_Buffer::count_clocks( long count ) const
{
	if ( !factor_ )
	{
		assert( 0 ); // sample rate and clock rates must be set first
		return 0;
	}
	
	if ( count > buffer_size_ )
		count = buffer_size_;
	blip_resampled_time_t time = (blip_resampled_time_t) count << BLIP_BUFFER_ACCURACY;
	return (blip_time_t) ((time - offset_ + factor_ - 1) / factor_);
}